

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O3

int main(void)

{
  Format mainFormat;
  string str;
  CppLogger errorLogger;
  CppLogger mainLogger;
  void *local_500 [2];
  long local_4f0;
  long *local_4e8;
  long local_4e0;
  long local_4d8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  string local_4a8;
  string local_488;
  long *local_468 [2];
  long local_458 [2];
  long *local_448 [2];
  long local_438 [2];
  long *local_428 [2];
  long local_418 [2];
  long *local_408 [2];
  long local_3f8 [2];
  long *local_3e8 [2];
  long local_3d8 [2];
  long *local_3c8 [2];
  long local_3b8 [2];
  long *local_3a8 [2];
  long local_398 [2];
  long *local_388 [2];
  long local_378 [2];
  long *local_368 [2];
  long local_358 [2];
  long *local_348 [2];
  long local_338 [2];
  long *local_328 [2];
  long local_318 [2];
  undefined4 local_308;
  undefined4 uStack_304;
  undefined4 uStack_300;
  undefined4 uStack_2fc;
  CppLogger local_190 [368];
  
  CppLogger::CppLogger::CppLogger(local_190,Trace,"Main",false);
  local_328[0] = local_318;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"Test","");
  CppLogger::CppLogger::printTrace(local_190,local_328);
  if (local_328[0] != local_318) {
    operator_delete(local_328[0],local_318[0] + 1);
  }
  local_308 = 2;
  uStack_304 = 1;
  uStack_300 = 3;
  uStack_2fc = 4;
  CppLogger::Format::Format((Format *)local_500,&local_308,4);
  CppLogger::CppLogger::setFormat((Format *)local_190);
  local_348[0] = local_338;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"Main","");
  CppLogger::CppLogger::printTrace(local_190,local_348);
  if (local_348[0] != local_338) {
    operator_delete(local_348[0],local_338[0] + 1);
  }
  local_368[0] = local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"Main","");
  CppLogger::CppLogger::printInfo(local_190,local_368);
  if (local_368[0] != local_358) {
    operator_delete(local_368[0],local_358[0] + 1);
  }
  local_388[0] = local_378;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"Main","");
  CppLogger::CppLogger::printWarn(local_190,local_388);
  if (local_388[0] != local_378) {
    operator_delete(local_388[0],local_378[0] + 1);
  }
  local_3a8[0] = local_398;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"Main","");
  CppLogger::CppLogger::printError(local_190,local_3a8);
  if (local_3a8[0] != local_398) {
    operator_delete(local_3a8[0],local_398[0] + 1);
  }
  local_3c8[0] = local_3b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"Main","");
  CppLogger::CppLogger::printFatalError(local_190,local_3c8);
  if (local_3c8[0] != local_3b8) {
    operator_delete(local_3c8[0],local_3b8[0] + 1);
  }
  CppLogger::CppLogger::CppLogger((CppLogger *)&local_308,Trace,"Error logger",false);
  CppLogger::CppLogger::setFormat((Format *)&local_308);
  CppLogger::CppLogger::setOStream((ostream *)&local_308);
  local_3e8[0] = local_3d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"Error","");
  CppLogger::CppLogger::printTrace(&local_308,local_3e8);
  if (local_3e8[0] != local_3d8) {
    operator_delete(local_3e8[0],local_3d8[0] + 1);
  }
  local_408[0] = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"Error","");
  CppLogger::CppLogger::printInfo(&local_308,local_408);
  if (local_408[0] != local_3f8) {
    operator_delete(local_408[0],local_3f8[0] + 1);
  }
  local_428[0] = local_418;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"Error","");
  CppLogger::CppLogger::printWarn(&local_308,local_428);
  if (local_428[0] != local_418) {
    operator_delete(local_428[0],local_418[0] + 1);
  }
  local_448[0] = local_438;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"Error","");
  CppLogger::CppLogger::printError(&local_308,local_448);
  if (local_448[0] != local_438) {
    operator_delete(local_448[0],local_438[0] + 1);
  }
  local_468[0] = local_458;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"Error","");
  CppLogger::CppLogger::printFatalError(&local_308,local_468);
  if (local_468[0] != local_458) {
    operator_delete(local_468[0],local_458[0] + 1);
  }
  local_4e8 = local_4d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"I shall be logged","");
  local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_488,"Printing a:{}, and b: {}, but not f;","");
  CppLogger::CppLogger::printTrace<int,char,float>((CppLogger *)&local_308,&local_488,5,'b',5.4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._M_dataplus._M_p != &local_488.field_2) {
    operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
  }
  local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"{}","");
  local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4c8,local_4e8,local_4e0 + (long)local_4e8);
  CppLogger::CppLogger::printWarn<std::__cxx11::string>
            ((CppLogger *)&local_308,&local_4a8,&local_4c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
    operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
    operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
  }
  if (local_4e8 != local_4d8) {
    operator_delete(local_4e8,local_4d8[0] + 1);
  }
  CppLogger::CppLogger::~CppLogger((CppLogger *)&local_308);
  if (local_500[0] != (void *)0x0) {
    operator_delete(local_500[0],local_4f0 - (long)local_500[0]);
  }
  CppLogger::CppLogger::~CppLogger(local_190);
  return 0;
}

Assistant:

int main() {
    // Creating a logger (the last parameter is false by default and 
    //  if is set to true it will exit after a printFatalError())
    CppLogger::CppLogger mainLogger(CppLogger::Level::Trace, "Main"/*, true*/);

    // Trace level log
    mainLogger.printTrace("Test");

    // Create a format for your logger (the order of the format is respected)
    CppLogger::Format mainFormat({
            CppLogger::FormatAttribute::Time,
            CppLogger::FormatAttribute::Name,
            CppLogger::FormatAttribute::Level,
            CppLogger::FormatAttribute::Message
            });

    // Apply the format to your logger
    mainLogger.setFormat(mainFormat);

    // Different levels of logging
    mainLogger.printTrace("Main");
    mainLogger.printInfo("Main");
    mainLogger.printWarn("Main");
    mainLogger.printError("Main");
    mainLogger.printFatalError("Main");

    CppLogger::CppLogger errorLogger(CppLogger::Level::Trace, "Error logger");

    errorLogger.setFormat(mainFormat);

    errorLogger.setOStream(std::cerr);

    errorLogger.printTrace("Error");
    errorLogger.printInfo("Error");
    errorLogger.printWarn("Error");
    errorLogger.printError("Error");
    errorLogger.printFatalError("Error");

    int a = 5;
    char b = 'b';
    std::string str = "I shall be logged";
    float f = 5.4f;

    errorLogger.printTrace("Printing a:{}, and b: {}, but not f;", a, b, f);
    errorLogger.printWarn("{}", str);
}